

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

int traversearray(global_State *g,Table *h)

{
  uint uVar1;
  GCObject *local_38;
  GCObject *o;
  int local_20;
  uint i;
  int marked;
  uint asize;
  Table *h_local;
  global_State *g_local;
  
  uVar1 = h->asize;
  local_20 = 0;
  for (o._4_4_ = 0; o._4_4_ < uVar1; o._4_4_ = o._4_4_ + 1) {
    if ((*(byte *)((long)h->array + (ulong)o._4_4_ + 4) & 0x40) == 0) {
      local_38 = (GCObject *)0x0;
    }
    else {
      local_38 = h->array[-1 - (ulong)o._4_4_].gc;
    }
    if ((local_38 != (GCObject *)0x0) && ((local_38->marked & 0x18) != 0)) {
      local_20 = 1;
      reallymarkobject(g,local_38);
    }
  }
  return local_20;
}

Assistant:

static int traversearray (global_State *g, Table *h) {
  unsigned asize = h->asize;
  int marked = 0;  /* true if some object is marked in this traversal */
  unsigned i;
  for (i = 0; i < asize; i++) {
    GCObject *o = gcvalarr(h, i);
    if (o != NULL && iswhite(o)) {
      marked = 1;
      reallymarkobject(g, o);
    }
  }
  return marked;
}